

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_gd.c
# Opt level: O0

gdImagePtr gdImageCreateFromGdCtx(gdIOCtxPtr in)

{
  int iVar1;
  int local_34;
  int ch;
  int pix;
  gdImagePtr im;
  int y;
  int x;
  int sy;
  int sx;
  gdIOCtxPtr in_local;
  
  _sy = in;
  _ch = _gdCreateFromFile(in,&x,&y);
  if (_ch == (gdImagePtr)0x0) {
    return (gdImagePtr)0x0;
  }
  if (_ch->trueColor == 0) {
    for (im._0_4_ = 0; (int)im < y; im._0_4_ = (int)im + 1) {
      for (im._4_4_ = 0; im._4_4_ < x; im._4_4_ = im._4_4_ + 1) {
        iVar1 = gdGetC(_sy);
        if (iVar1 == -1) goto LAB_0011b6d7;
        _ch->pixels[(int)im][im._4_4_] = (uchar)iVar1;
      }
    }
  }
  else {
    for (im._0_4_ = 0; (int)im < y; im._0_4_ = (int)im + 1) {
      for (im._4_4_ = 0; im._4_4_ < x; im._4_4_ = im._4_4_ + 1) {
        iVar1 = gdGetInt(&local_34,_sy);
        if (iVar1 == 0) {
LAB_0011b6d7:
          gdImageDestroy(_ch);
          return (gdImagePtr)0x0;
        }
        _ch->tpixels[(int)im][im._4_4_] = local_34;
      }
    }
  }
  return _ch;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageCreateFromGdCtx (gdIOCtxPtr in)
{
	int sx, sy;
	int x, y;
	gdImagePtr im;

	/* Read the header */
	im = _gdCreateFromFile (in, &sx, &sy);

	if (im == NULL) {
		goto fail1;
	};

	/* Then the data... */
	/* 2.0.12: support truecolor properly in .gd as well as in .gd2.
	   Problem reported by Andreas Pfaller. */
	if (im->trueColor) {
		for (y = 0; (y < sy); y++) {
			for (x = 0; (x < sx); x++) {
				int pix;
				if (!gdGetInt (&pix, in)) {
					goto fail2;
				}
				im->tpixels[y][x] = pix;
			}
		}
	} else {
		for (y = 0; (y < sy); y++) {
			for (x = 0; (x < sx); x++) {
				int ch;
				ch = gdGetC (in);
				if (ch == EOF) {
					goto fail2;
				}
				/* ROW-MAJOR IN GD 1.3 */
				im->pixels[y][x] = ch;
			}
		}
	}
	return im;

fail2:
	gdImageDestroy (im);
fail1:
	return 0;
}